

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O1

int claim_address(int sock,uint64_t name,int sa)

{
  int iVar1;
  uint8_t uVar2;
  sockaddr_can saddr;
  sockaddr local_30;
  undefined4 local_20;
  uint8_t local_1c;
  
  local_30.sa_family = 0x1d;
  local_30.sa_data._2_4_ = if_nametoindex(s.intf);
  local_20 = 0x40000;
  uVar2 = (uint8_t)sa;
  local_30.sa_data._6_8_ = name;
  local_1c = uVar2;
  if (s.verbose != 0) {
    claim_address_cold_1();
  }
  iVar1 = bind(sock,&local_30,0x18);
  if (-1 < iVar1) {
    s.last_sa = uVar2;
    iVar1 = repeat_address(sock,name);
    return iVar1;
  }
  err(1,"rebind with sa 0x%02x",sa);
}

Assistant:

static int claim_address(int sock, uint64_t name, int sa)
{
	int ret;
	struct sockaddr_can saddr = {
		.can_family = AF_CAN,
		.can_addr.j1939 = {
			.name = name,
			.addr = sa,
			.pgn = J1939_NO_PGN,
		},
		.can_ifindex = if_nametoindex(s.intf),
	};

	if (s.verbose)
		fprintf(stderr, "- bind(, %s, %zi);\n", libj1939_addr2str(&saddr), sizeof(saddr));
	ret = bind(sock, (void *)&saddr, sizeof(saddr));
	if (ret < 0)
		err(1, "rebind with sa 0x%02x", sa);
	s.last_sa = sa;
	return repeat_address(sock, name);
}